

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v8::detail::dragonbox::is_center_integer<float>
               (carrier_uint two_f,int exponent,int minus_k)

{
  int in_EDX;
  uint32_t in_ESI;
  undefined1 local_1;
  
  if ((int)in_ESI < 0x28) {
    if ((int)in_ESI < 7) {
      if ((int)in_ESI < -2) {
        local_1 = divisible_by_power_of_2(in_ESI,in_EDX);
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = divisible_by_power_of_5(in_ESI,in_EDX);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_center_integer(typename float_info<T>::carrier_uint two_f, int exponent,
                       int minus_k) FMT_NOEXCEPT {
  // Exponent for 5 is negative.
  if (exponent > float_info<T>::divisibility_check_by_5_threshold) return false;
  if (exponent > float_info<T>::case_fc_upper_threshold)
    return divisible_by_power_of_5(two_f, minus_k);
  // Both exponents are nonnegative.
  if (exponent >= float_info<T>::case_fc_lower_threshold) return true;
  // Exponent for 2 is negative.
  return divisible_by_power_of_2(two_f, minus_k - exponent + 1);
}